

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void ZopfliCleanHash(ZopfliHash *h)

{
  undefined8 *in_RDI;
  
  free((void *)*in_RDI);
  free((void *)in_RDI[1]);
  free((void *)in_RDI[2]);
  free((void *)in_RDI[4]);
  free((void *)in_RDI[5]);
  free((void *)in_RDI[6]);
  free((void *)in_RDI[8]);
  return;
}

Assistant:

void ZopfliCleanHash(ZopfliHash* h) {
  free(h->head);
  free(h->prev);
  free(h->hashval);

#ifdef ZOPFLI_HASH_SAME_HASH
  free(h->head2);
  free(h->prev2);
  free(h->hashval2);
#endif

#ifdef ZOPFLI_HASH_SAME
  free(h->same);
#endif
}